

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

__pid_t __thiscall
kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>::wait
          (Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> *this,
          void *__stat_loc)

{
  SourceLocation location;
  WaitScope *in_RDX;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> result;
  ExceptionOrValue local_1e8;
  char local_50;
  PromiseNode *local_48;
  PromiseNode *pPStack_40;
  PromiseNode *local_38;
  PromiseNode *pPStack_30;
  PromiseNode *local_28;
  PromiseNode *pPStack_20;
  PromiseNode *local_18;
  PromiseNode *pPStack_10;
  
  local_1e8.exception.ptr.isSet = false;
  local_50 = '\0';
  location.function = (char *)in_stack_00000010;
  location.fileName = (char *)in_stack_00000008;
  location._16_8_ = in_stack_00000018;
  kj::_::waitImpl((OwnPromiseNode *)__stat_loc,&local_1e8,in_RDX,location);
  if (local_50 == '\x01') {
    if (local_1e8.exception.ptr.isSet != false) {
      throwRecoverableException(&local_1e8.exception.ptr.field_1.value,0);
    }
    this[4].super_PromiseBase.node.ptr = local_28;
    this[5].super_PromiseBase.node.ptr = pPStack_20;
    this[2].super_PromiseBase.node.ptr = local_38;
    this[3].super_PromiseBase.node.ptr = pPStack_30;
    (this->super_PromiseBase).node.ptr = local_48;
    this[1].super_PromiseBase.node.ptr = pPStack_40;
    this[6].super_PromiseBase.node.ptr = local_18;
    this[7].super_PromiseBase.node.ptr = pPStack_10;
    pPStack_10 = (PromiseNode *)0x0;
    if ((local_1e8.exception.ptr.isSet & 1U) != 0) {
      Exception::~Exception(&local_1e8.exception.ptr.field_1.value);
    }
    return (__pid_t)this;
  }
  if (local_1e8.exception.ptr.isSet != false) {
    throwFatalException(&local_1e8.exception.ptr.field_1.value,0);
  }
  kj::_::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope, SourceLocation location) {
  _::ExceptionOr<_::FixVoid<T>> result;
  _::waitImpl(kj::mv(node), result, waitScope, location);
  return convertToReturn(kj::mv(result));
}